

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int modified_set_message_annotations(MODIFIED_HANDLE modified,fields message_annotations_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  MODIFIED_INSTANCE *modified_instance;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    iVar2 = 0x483b;
  }
  else {
    item_value = amqpvalue_clone(message_annotations_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x4843;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(modified->composite_value,2,item_value);
      iVar2 = 0x4849;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int modified_set_message_annotations(MODIFIED_HANDLE modified, fields message_annotations_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        AMQP_VALUE message_annotations_amqp_value = amqpvalue_create_fields(message_annotations_value);
        if (message_annotations_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(modified_instance->composite_value, 2, message_annotations_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(message_annotations_amqp_value);
        }
    }

    return result;
}